

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O0

Real __thiscall NavierStokesBase::initialTimeStep(NavierStokesBase *this)

{
  Print *x;
  long *in_RDI;
  double dVar1;
  Real returnDt;
  char (*in_stack_fffffffffffffe38) [37];
  Print *this_00;
  ostream *in_stack_fffffffffffffe68;
  Print *in_stack_fffffffffffffe70;
  Print *in_stack_fffffffffffffeb0;
  
  this_00 = (Print *)init_shrink;
  dVar1 = (double)(**(code **)(*in_RDI + 0x188))();
  dVar1 = (double)this_00 * dVar1;
  amrex::OutStream();
  amrex::Print::Print(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  amrex::Print::operator<<(this_00,in_stack_fffffffffffffe38);
  x = amrex::Print::operator<<(this_00,(double *)in_stack_fffffffffffffe38);
  amrex::Print::operator<<(this_00,(char *)x);
  amrex::Print::~Print(in_stack_fffffffffffffeb0);
  return dVar1;
}

Assistant:

Real
NavierStokesBase::initialTimeStep ()
{
    Real returnDt = init_shrink*estTimeStep();

    amrex::Print() << "Multiplying dt by init_shrink: dt = "
                   << returnDt << '\n';
    return returnDt;
}